

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_impl.h
# Opt level: O0

void secp256k1_rfc6979_hmac_sha256_generate
               (secp256k1_rfc6979_hmac_sha256 *rng,uchar *out,size_t outlen)

{
  long in_RDX;
  void *in_RSI;
  void *in_RDI;
  int now;
  secp256k1_hmac_sha256 hmac_1;
  secp256k1_hmac_sha256 hmac;
  uchar *in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  int iVar1;
  uchar *in_stack_fffffffffffffe58;
  secp256k1_hmac_sha256 *in_stack_fffffffffffffe60;
  size_t in_stack_fffffffffffffef0;
  uchar *in_stack_fffffffffffffef8;
  secp256k1_hmac_sha256 *in_stack_ffffffffffffff00;
  undefined8 local_18;
  undefined8 local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (*(int *)((long)in_RDI + 0x40) != 0) {
    secp256k1_hmac_sha256_initialize
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    secp256k1_hmac_sha256_write
              ((secp256k1_hmac_sha256 *)
               CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
               in_stack_fffffffffffffe38,0x1214d9);
    secp256k1_hmac_sha256_write
              ((secp256k1_hmac_sha256 *)
               CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
               in_stack_fffffffffffffe38,0x1214f2);
    secp256k1_hmac_sha256_finalize(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    secp256k1_hmac_sha256_initialize
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    secp256k1_hmac_sha256_write
              ((secp256k1_hmac_sha256 *)
               CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
               in_stack_fffffffffffffe38,0x121543);
    secp256k1_hmac_sha256_finalize(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  }
  for (; local_18 != 0; local_18 = local_18 - iVar1) {
    iVar1 = (int)local_18;
    secp256k1_hmac_sha256_initialize
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    secp256k1_hmac_sha256_write
              ((secp256k1_hmac_sha256 *)CONCAT44(iVar1,in_stack_fffffffffffffe40),
               in_stack_fffffffffffffe38,0x1215a7);
    secp256k1_hmac_sha256_finalize(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    if (0x20 < iVar1) {
      iVar1 = 0x20;
    }
    memcpy(local_10,in_RDI,(long)iVar1);
    local_10 = (void *)((long)local_10 + (long)iVar1);
  }
  *(undefined4 *)((long)in_RDI + 0x40) = 1;
  return;
}

Assistant:

static void secp256k1_rfc6979_hmac_sha256_generate(secp256k1_rfc6979_hmac_sha256 *rng, unsigned char *out, size_t outlen) {
    /* RFC6979 3.2.h. */
    static const unsigned char zero[1] = {0x00};
    if (rng->retry) {
        secp256k1_hmac_sha256 hmac;
        secp256k1_hmac_sha256_initialize(&hmac, rng->k, 32);
        secp256k1_hmac_sha256_write(&hmac, rng->v, 32);
        secp256k1_hmac_sha256_write(&hmac, zero, 1);
        secp256k1_hmac_sha256_finalize(&hmac, rng->k);
        secp256k1_hmac_sha256_initialize(&hmac, rng->k, 32);
        secp256k1_hmac_sha256_write(&hmac, rng->v, 32);
        secp256k1_hmac_sha256_finalize(&hmac, rng->v);
    }

    while (outlen > 0) {
        secp256k1_hmac_sha256 hmac;
        int now = outlen;
        secp256k1_hmac_sha256_initialize(&hmac, rng->k, 32);
        secp256k1_hmac_sha256_write(&hmac, rng->v, 32);
        secp256k1_hmac_sha256_finalize(&hmac, rng->v);
        if (now > 32) {
            now = 32;
        }
        memcpy(out, rng->v, now);
        out += now;
        outlen -= now;
    }

    rng->retry = 1;
}